

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugRangeList::dump(DWARFDebugRangeList *this,raw_ostream *OS)

{
  bool bVar1;
  unsigned_long *in_R9;
  format_object<unsigned_long> local_80;
  format_object<unsigned_long,_unsigned_long,_unsigned_long> local_68;
  llvm *local_40;
  char *format_str;
  RangeListEntry *RLE;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
  *__range1;
  raw_ostream *OS_local;
  DWARFDebugRangeList *this_local;
  
  __end1 = std::
           vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
           ::begin(&this->Entries);
  RLE = (RangeListEntry *)
        std::
        vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
        ::end(&this->Entries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
                                *)&RLE);
    if (!bVar1) break;
    format_str = (char *)__gnu_cxx::
                         __normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
                         ::operator*(&__end1);
    local_40 = (llvm *)0x297cb8d;
    if (this->AddressSize == '\x04') {
      local_40 = (llvm *)0x297cb7a;
    }
    format<unsigned_long,unsigned_long,unsigned_long>
              (&local_68,local_40,(char *)this,(unsigned_long *)format_str,
               &((reference)format_str)->EndAddress,in_R9);
    raw_ostream::operator<<(OS,&local_68.super_format_object_base);
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFDebugRangeList::RangeListEntry_*,_std::vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>_>
    ::operator++(&__end1);
  }
  format<unsigned_long>(&local_80,"%08lx <End of list>\n",&this->Offset);
  raw_ostream::operator<<(OS,&local_80.super_format_object_base);
  return;
}

Assistant:

void DWARFDebugRangeList::dump(raw_ostream &OS) const {
  for (const RangeListEntry &RLE : Entries) {
    const char *format_str =
        (AddressSize == 4 ? "%08" PRIx64 " %08" PRIx64 " %08" PRIx64 "\n"
                          : "%08" PRIx64 " %016" PRIx64 " %016" PRIx64 "\n");
    OS << format(format_str, Offset, RLE.StartAddress, RLE.EndAddress);
  }
  OS << format("%08" PRIx64 " <End of list>\n", Offset);
}